

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

int main(void)

{
  size_t __new_size;
  uchar *ptr;
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  value_type *p;
  undefined1 local_240 [4];
  int i_1;
  SpanBytesConst deserialize_ptr;
  Image image_out;
  SpanBytes serialize_ptr;
  size_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  value_type local_130;
  int local_114;
  undefined4 uStack_110;
  int i;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  value_type local_cd [13];
  undefined1 local_c0 [8];
  Image image;
  
  image.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._4_4_ = 0;
  Image::Image((Image *)local_c0);
  std::__cxx11::string::operator=((string *)&image,"pepito");
  local_c0._0_4_ = 0x280;
  local_c0._4_4_ = 0x1e0;
  local_cd[0] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&image.field_0x20,0x4b000,
             local_cd);
  local_e8 = 0x3ff0000000000000;
  local_e0 = 0x4000000000000000;
  local_d8 = 0x4008000000000000;
  image.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
  image.pose.pos.x = 2.0;
  image.pose.pos.y = 3.0;
  local_108 = 0x3fb999999999999a;
  local_100 = 0x3fc999999999999a;
  local_f8 = 0x3fd3333333333333;
  local_f0 = 0x3fd999999999999a;
  image.pose.pos.z = 0.1;
  image.pose.rot.x = 0.2;
  image.pose.rot.y = 0.3;
  image.pose.rot.z = 0.4;
  uStack_110 = 0x2a;
  i = 0x45;
  image.pose.rot.w = 1.46417709597355e-312;
  for (local_114 = 0; local_114 < 4; local_114 = local_114 + 1) {
    local_130.x = (double)local_114;
    local_130.y = (double)(local_114 + 1);
    local_130.z = (double)(local_114 + 2);
    std::vector<Point3D,_std::allocator<Point3D>_>::push_back
              ((vector<Point3D,_std::allocator<Point3D>_> *)
               &image.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl.
                _M_node._M_size,&local_130);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x3fb999999999999a;
    std::__cxx11::list<Quaternion,_std::allocator<Quaternion>_>::push_back
              ((list<Quaternion,_std::allocator<Quaternion>_> *)&image.array,
               (value_type *)
               &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&size);
  __new_size = SerializeMe::BufferSize<Image>((Image *)local_c0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&size,__new_size);
  SerializeMe::Span<unsigned_char>::Span
            ((Span<unsigned_char> *)
             &image_out.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&size);
  SerializeMe::SerializeIntoBuffer<Image>
            ((SpanBytes *)
             &image_out.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Image *)local_c0);
  Image::Image((Image *)&deserialize_ptr.size_);
  ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&size);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&size);
  SerializeMe::Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)local_240,ptr,sVar1);
  SerializeMe::DeserializeFromBuffer<Image>
            ((SpanBytesConst *)local_240,(Image *)&deserialize_ptr.size_);
  poVar2 = std::operator<<((ostream *)&std::cout,"Image name: ");
  poVar2 = std::operator<<(poVar2,(string *)&image_out);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Image width: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)deserialize_ptr.size_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Image height: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,deserialize_ptr.size_._4_4_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Pixels count: ");
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&image_out.field_0x20)
  ;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Pose/pos: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(double)image_out.data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,image_out.pose.pos.x);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,image_out.pose.pos.y);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Pose/rot: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,image_out.pose.pos.z);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,image_out.pose.rot.x);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,image_out.pose.rot.y);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,image_out.pose.rot.z);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  p._4_4_ = 0;
  while( true ) {
    sVar1 = std::vector<Point3D,_std::allocator<Point3D>_>::size
                      ((vector<Point3D,_std::allocator<Point3D>_> *)
                       &image_out.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>.
                        _M_impl._M_node._M_size);
    if (sVar1 <= (ulong)(long)p._4_4_) break;
    pvVar3 = std::vector<Point3D,_std::allocator<Point3D>_>::operator[]
                       ((vector<Point3D,_std::allocator<Point3D>_> *)
                        &image_out.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>.
                         _M_impl._M_node._M_size,(long)p._4_4_);
    poVar2 = std::operator<<((ostream *)&std::cout,"Point[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,p._4_4_);
    poVar2 = std::operator<<(poVar2,"]: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar3->x);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar3->y);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar3->z);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    p._4_4_ = p._4_4_ + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Buffer size: ");
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&size);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  image.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._4_4_ = 0;
  Image::~Image((Image *)&deserialize_ptr.size_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&size);
  Image::~Image((Image *)local_c0);
  return image.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main()
{
  Image image;

  image.name = "pepito";
  image.width = 640;
  image.height = 480;
  image.data.resize(image.width * image.height, 0);
  image.pose.pos = {1, 2, 3};
  image.pose.rot = {0.1, 0.2, 0.3, 0.4};
  image.array = {42, 69};
  for (int i = 0; i < 4; i++)
  {
    image.points.push_back(Point3D{double(i), double(i + 1), double(i + 2)});
    image.quats.push_back({0.1, -0.2, 0.3, -0.4});
  }

  //--- This is the serialized buffer. Allocate memory manually -----
  std::vector<uint8_t> buffer;
  size_t size = SerializeMe::BufferSize(image);
  buffer.resize(size);

  //------ Serialize into the buffer -----
  SerializeMe::SpanBytes serialize_ptr(buffer);
  SerializeMe::SerializeIntoBuffer(serialize_ptr, image);

  //------ Deserialize from buffer to image -----
  Image image_out;
  SerializeMe::SpanBytesConst deserialize_ptr(buffer.data(), buffer.size());
  SerializeMe::DeserializeFromBuffer(deserialize_ptr, image_out);

  //------ Check results -------
  std::cout << "Image name: " << image_out.name << std::endl;
  std::cout << "Image width: " << image_out.width << std::endl;
  std::cout << "Image height: " << image_out.height << std::endl;
  std::cout << "Pixels count: " << image_out.data.size() << std::endl;

  std::cout << "Pose/pos: " << image_out.pose.pos.x << ", " << image_out.pose.pos.y
            << ", " << image_out.pose.pos.z << std::endl;

  std::cout << "Pose/rot: " << image_out.pose.rot.x << ", " << image_out.pose.rot.y
            << ", " << image_out.pose.rot.z << ", " << image_out.pose.rot.w << std::endl;

  for (int i = 0; i < image_out.points.size(); i++)
  {
    const auto& p = image_out.points[i];
    std::cout << "Point[" << i << "]: " << p.x << ", " << p.y << ", " << p.z << std::endl;
  }

  std::cout << "Buffer size: " << buffer.size() << std::endl;

  return 0;
}